

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O3

word If_ManSat6Truth(word uBound,word uFree,int *pBSet,int nBSet,int *pSSet,int nSSet,int *pFSet,
                    int nFSet)

{
  int iVar1;
  ulong uVar2;
  word wVar3;
  ulong uVar4;
  bool bVar5;
  word local_58 [5];
  
  uVar2 = 0;
  uVar4 = uVar2;
  if (0 < nSSet) {
    do {
      local_58[uVar2] = s_Truths6[pSSet[uVar2]];
      uVar2 = uVar2 + 1;
      uVar4 = (ulong)(uint)nSSet;
    } while ((uint)nSSet != uVar2);
  }
  iVar1 = (int)uVar4;
  if (0 < nBSet) {
    uVar2 = 0;
    do {
      local_58[uVar4 + uVar2] = s_Truths6[pBSet[uVar2]];
      uVar2 = uVar2 + 1;
    } while ((uint)nBSet != uVar2);
    iVar1 = iVar1 + (int)uVar2;
  }
  local_58[0] = If_ManSat6ComposeLut4((uint)uBound & 0xffff,local_58,iVar1);
  if (nSSet < 1) {
    uVar4 = 1;
  }
  else {
    uVar2 = 1;
    do {
      local_58[uVar2] = s_Truths6[pSSet[uVar2 - 1]];
      uVar4 = uVar2 + 1;
      bVar5 = uVar2 != (uint)nSSet;
      uVar2 = uVar4;
    } while (bVar5);
  }
  iVar1 = (int)uVar4;
  if (0 < nFSet) {
    uVar2 = 0;
    do {
      local_58[(uVar4 & 0xffffffff) + uVar2] = s_Truths6[pFSet[uVar2]];
      uVar2 = uVar2 + 1;
    } while ((uint)nFSet != uVar2);
    iVar1 = iVar1 + (int)uVar2;
  }
  wVar3 = If_ManSat6ComposeLut4((uint)uFree & 0xffff,local_58,iVar1);
  return wVar3;
}

Assistant:

word If_ManSat6Truth( word uBound, word uFree, int * pBSet, int nBSet, int * pSSet, int nSSet, int * pFSet, int nFSet )
{
    word r, q, f[4];
    int i, k = 0;
    // bound set vars
    for ( i = 0; i < nSSet; i++ )
        f[k++] = s_Truths6[pSSet[i]];
    for ( i = 0; i < nBSet; i++ )
        f[k++] = s_Truths6[pBSet[i]];
    q = If_ManSat6ComposeLut4( (int)(uBound & 0xffff), f, k );
    // free set vars
    k = 0;
    f[k++] = q;
    for ( i = 0; i < nSSet; i++ )
        f[k++] = s_Truths6[pSSet[i]];
    for ( i = 0; i < nFSet; i++ )
        f[k++] = s_Truths6[pFSet[i]];
    r = If_ManSat6ComposeLut4( (int)(uFree & 0xffff), f, k );
    return r;
}